

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getCoeff(Highs *this,HighsInt row,HighsInt col,double *value)

{
  uint in_EDX;
  uint in_ESI;
  double *in_RDI;
  Highs *unaff_retaddr;
  HighsInt in_stack_fffffffffffffff8;
  HighsInt in_stack_fffffffffffffffc;
  HighsStatus HVar1;
  
  if (((int)in_ESI < 0) || (*(int *)((long)in_RDI + 0x13c) <= (int)in_ESI)) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0x1c5),kError,
                 "Row %d supplied to Highs::getCoeff is not in the range [0, %d]\n",(ulong)in_ESI,
                 (ulong)*(uint *)((long)in_RDI + 0x13c));
    HVar1 = kError;
  }
  else if (((int)in_EDX < 0) || (*(int *)(in_RDI + 0x27) <= (int)in_EDX)) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0x1c5),kError,
                 "Col %d supplied to Highs::getCoeff is not in the range [0, %d]\n",(ulong)in_EDX,
                 (ulong)*(uint *)(in_RDI + 0x27));
    HVar1 = kError;
  }
  else {
    getCoefficientInterface
              (unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8,in_RDI);
    HVar1 = kOk;
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::getCoeff(const HighsInt row, const HighsInt col,
                            double& value) const {
  if (row < 0 || row >= model_.lp_.num_row_) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Row %" HIGHSINT_FORMAT
        " supplied to Highs::getCoeff is not in the range [0, %" HIGHSINT_FORMAT
        "]\n",
        row, model_.lp_.num_row_);
    return HighsStatus::kError;
  }
  if (col < 0 || col >= model_.lp_.num_col_) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Col %" HIGHSINT_FORMAT
        " supplied to Highs::getCoeff is not in the range [0, %" HIGHSINT_FORMAT
        "]\n",
        col, model_.lp_.num_col_);
    return HighsStatus::kError;
  }
  getCoefficientInterface(row, col, value);
  return HighsStatus::kOk;
}